

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

void __thiscall
helics::NetworkCommsInterface::setPortNumber(NetworkCommsInterface *this,int localPortNumber)

{
  bool bVar1;
  
  bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
  if (bVar1) {
    LOCK();
    (this->PortNumber).super___atomic_base<int>._M_i = localPortNumber;
    UNLOCK();
    if (0 < (this->PortNumber).super___atomic_base<int>._M_i) {
      this->autoPortNumber = false;
    }
    CommsInterface::propertyUnLock(&this->super_CommsInterface);
    return;
  }
  return;
}

Assistant:

void NetworkCommsInterface::setPortNumber(int localPortNumber)
{
    if (propertyLock()) {
        PortNumber = localPortNumber;
        if (PortNumber > 0) {
            autoPortNumber = false;
        }
        propertyUnLock();
    }
}